

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 FixLargeWindowsWhenUndocking(ImVec2 *size,ImGuiViewport *ref_viewport)

{
  short sVar1;
  ImGuiPlatformMonitor *pIVar2;
  ImVec2 *pIVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  if (ref_viewport != (ImGuiViewport *)0x0) {
    if ((GImGui->ConfigFlagsCurrFrame & 0x400) == 0) {
      pIVar3 = &ref_viewport->WorkSize;
    }
    else {
      sVar1 = *(short *)&ref_viewport[1].WorkPos.y;
      if ((sVar1 < 0) || ((GImGui->PlatformIO).Monitors.Size <= (int)sVar1)) {
        pIVar2 = &GImGui->FallbackMonitor;
      }
      else {
        pIVar2 = (GImGui->PlatformIO).Monitors.Data + (uint)(int)sVar1;
      }
      pIVar3 = &pIVar2->WorkSize;
    }
    auVar4._8_8_ = 0;
    auVar4._0_4_ = size->x;
    auVar4._4_4_ = size->y;
    auVar5._4_4_ = (float)(int)((*pIVar3).y * (float)0x3f666666);
    auVar5._0_4_ = (float)(int)((*pIVar3).x * (float)0x3f666666);
    auVar5._8_8_ = 0;
    auVar5 = minps(auVar4,auVar5);
    return auVar5._0_8_;
  }
  return *size;
}

Assistant:

static ImVec2 FixLargeWindowsWhenUndocking(const ImVec2& size, ImGuiViewport* ref_viewport)
{
    if (ref_viewport == NULL)
        return size;

    ImGuiContext& g = *GImGui;
    ImVec2 max_size = ImFloor(ref_viewport->WorkSize * 0.90f);
    if (g.ConfigFlagsCurrFrame & ImGuiConfigFlags_ViewportsEnable)
    {
        const ImGuiPlatformMonitor* monitor = ImGui::GetViewportPlatformMonitor(ref_viewport);
        max_size = ImFloor(monitor->WorkSize * 0.90f);
    }
    return ImMin(size, max_size);
}